

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O2

int __thiscall
IDisk::AddMFMByteToSpecificTrack
          (IDisk *this,int side,int track,int rev,uint index,uchar byte,int datasize)

{
  Revolution *pRVar1;
  ulong uVar2;
  undefined3 in_register_00000089;
  int iVar3;
  bool bVar4;
  
  uVar2 = (ulong)index;
  iVar3 = 0;
  if (0 < datasize) {
    iVar3 = datasize;
  }
  while( true ) {
    datasize = datasize - 1;
    bVar4 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar4) break;
    pRVar1 = this->side_[side].tracks[track].revolution;
    if (pRVar1[rev].size <= (uint)uVar2) {
      uVar2 = 0;
    }
    pRVar1[rev].bitfield[uVar2] =
         (CONCAT31(in_register_00000089,byte) >> (datasize & 0x1fU) & 1) != 0;
    uVar2 = (ulong)((int)uVar2 + 1);
  }
  return (uint)uVar2;
}

Assistant:

int IDisk::AddMFMByteToSpecificTrack(int side, int track, int rev, unsigned int index, unsigned char byte, int datasize)
{
   for (int d = 0; d < datasize; d++)
   {
      if (index >= side_[side].tracks[track].revolution[rev].size)
      {
         index = 0;
      }
      side_[side].tracks[track].revolution[rev].bitfield[index++] = ((byte >> (datasize - 1 - d)) & 0x01);
   }
   return index;
}